

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

int4 __thiscall
BlockCondition::flipInPlaceTest
          (BlockCondition *this,vector<PcodeOp_*,_std::allocator<PcodeOp_*>_> *fliplist)

{
  int iVar1;
  FlowBlock *pFVar2;
  undefined4 extraout_var;
  long *plVar4;
  int4 subtest2;
  int4 subtest1;
  FlowBlock *split2;
  FlowBlock *split1;
  vector<PcodeOp_*,_std::allocator<PcodeOp_*>_> *fliplist_local;
  BlockCondition *this_local;
  long *plVar3;
  undefined4 extraout_var_00;
  
  pFVar2 = BlockGraph::getBlock(&this->super_BlockGraph,0);
  iVar1 = (*pFVar2->_vptr_FlowBlock[0x11])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar3 == (long *)0x0) {
    this_local._4_4_ = 2;
  }
  else {
    pFVar2 = BlockGraph::getBlock(&this->super_BlockGraph,1);
    iVar1 = (*pFVar2->_vptr_FlowBlock[0x11])();
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar1);
    if (plVar4 == (long *)0x0) {
      this_local._4_4_ = 2;
    }
    else {
      this_local._4_4_ = (**(code **)(*plVar3 + 0x90))(plVar3,fliplist);
      if (this_local._4_4_ == 2) {
        this_local._4_4_ = 2;
      }
      else {
        iVar1 = (**(code **)(*plVar4 + 0x90))(plVar4,fliplist);
        if (iVar1 == 2) {
          this_local._4_4_ = 2;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int4 BlockCondition::flipInPlaceTest(vector<PcodeOp *> &fliplist) const

{
  FlowBlock *split1 = getBlock(0)->getSplitPoint();
  if (split1 == (FlowBlock *)0)
    return 2;
  FlowBlock *split2 = getBlock(1)->getSplitPoint();
  if (split2 == (FlowBlock *)0)
    return 2;
  int4 subtest1 = split1->flipInPlaceTest(fliplist);
  if (subtest1 == 2)
    return 2;
  int4 subtest2 = split2->flipInPlaceTest(fliplist);
  if (subtest2 == 2)
    return 2;
  return subtest1;
}